

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.hpp
# Opt level: O0

string * duckdb::DuckDBPlatform(void)

{
  string *in_RDI;
  string postfix;
  string arch;
  string os;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *__lhs;
  char *in_stack_ffffffffffffff30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  string asStack_b0 [39];
  allocator aStack_89;
  string asStack_88 [39];
  undefined1 auStack_61 [56];
  allocator aStack_29;
  string asStack_28 [40];
  
  __lhs = in_RDI;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_28,"linux",&aStack_29);
  ::std::allocator<char>::~allocator((allocator<char> *)&aStack_29);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_61;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)(auStack_61 + 1),"amd64",(allocator *)__rhs);
  ::std::allocator<char>::~allocator((allocator<char> *)auStack_61);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(asStack_88,anon_var_dwarf_3e6c275 + 9,&aStack_89);
  ::std::allocator<char>::~allocator((allocator<char> *)&aStack_89);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  ::std::operator+<char,_std::char_traits<char>,_std::allocator<char>_>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,__rhs);
  ::std::__cxx11::string::~string(asStack_b0);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
  ::std::__cxx11::string::~string(asStack_88);
  ::std::__cxx11::string::~string((string *)(auStack_61 + 1));
  ::std::__cxx11::string::~string(asStack_28);
  return in_RDI;
}

Assistant:

std::string DuckDBPlatform() { // NOLINT: allow definition in header
#if defined(DUCKDB_CUSTOM_PLATFORM)
	return DUCKDB_QUOTE_DEFINE(DUCKDB_CUSTOM_PLATFORM);
#else
#if defined(DUCKDB_WASM_VERSION)
	// DuckDB-Wasm requires CUSTOM_PLATFORM to be defined
	static_assert(0, "DUCKDB_WASM_VERSION should rely on CUSTOM_PLATFORM being provided");
#endif
	std::string os = "linux";
#if INTPTR_MAX == INT64_MAX
	std::string arch = "amd64";
#elif INTPTR_MAX == INT32_MAX
	std::string arch = "i686";
#else
#error Unknown pointer size or missing size macros!
#endif
	std::string postfix = "";

#ifdef _WIN32
	os = "windows";
#elif defined(__APPLE__)
	os = "osx";
#elif defined(__FreeBSD__)
	os = "freebsd";
#endif
#if defined(__aarch64__) || defined(__ARM_ARCH_ISA_A64)
	arch = "arm64";
#endif

#if defined(__MUSL__)
	if (os == "linux") {
		postfix = "_musl";
	}
#elif (!defined(__clang__) && defined(__GNUC__) && __GNUC__ < 5) ||                                                    \
    (defined(_GLIBCXX_USE_CXX11_ABI) && _GLIBCXX_USE_CXX11_ABI == 0)
#error                                                                                                                 \
    "DuckDB does not provide extensions for this (legacy) CXX ABI - Explicitly set DUCKDB_PLATFORM (Makefile) / DUCKDB_EXPLICIT_PLATFORM (CMake) to build anyway. "
#endif

#if defined(__ANDROID__)
	postfix = "_android";
#endif
#ifdef __MINGW32__
	postfix = "_mingw";
#endif
// this is used for the windows R builds which use `mingw` equivalent extensions
#ifdef DUCKDB_PLATFORM_RTOOLS
	postfix = "_mingw";
#endif
	return os + "_" + arch + postfix;
#endif
}